

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyArrayWriter::AppendFromSelf
          (SnappyArrayWriter *this,size_t offset,size_t len,char **op_p)

{
  char *op_limit;
  char *op;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  char *pcVar9;
  
  op = *op_p;
  if ((ulong)((long)op - (long)this->base_) < offset) {
LAB_01e20dfe:
    bVar8 = false;
  }
  else {
    op_limit = op + len;
    if ((offset < len) || (this->op_limit_min_slop_ <= op)) {
      if (offset == 0 || this->op_limit_ < op_limit) goto LAB_01e20dfe;
      anon_unknown_3::IncrementalCopy(op + -offset,op,op_limit,this->op_limit_);
    }
    else {
      pcVar9 = op + -offset;
      uVar1 = *(undefined8 *)pcVar9;
      uVar2 = *(undefined8 *)(pcVar9 + 8);
      uVar3 = *(undefined8 *)(pcVar9 + 0x10);
      uVar4 = *(undefined8 *)(pcVar9 + 0x18);
      uVar5 = *(undefined8 *)(pcVar9 + 0x20);
      uVar6 = *(undefined8 *)(pcVar9 + 0x28);
      uVar7 = *(undefined8 *)(pcVar9 + 0x38);
      *(undefined8 *)(op + 0x30) = *(undefined8 *)(pcVar9 + 0x30);
      *(undefined8 *)(op + 0x38) = uVar7;
      *(undefined8 *)(op + 0x20) = uVar5;
      *(undefined8 *)(op + 0x28) = uVar6;
      *(undefined8 *)(op + 0x10) = uVar3;
      *(undefined8 *)(op + 0x18) = uVar4;
      *(undefined8 *)op = uVar1;
      *(undefined8 *)(op + 8) = uVar2;
    }
    *op_p = op_limit;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

SNAPPY_ATTRIBUTE_ALWAYS_INLINE
  inline bool AppendFromSelf(size_t offset, size_t len, char** op_p) {
    assert(len > 0);
    char* const op = *op_p;
    assert(op >= base_);
    char* const op_end = op + len;

    // Check if we try to append from before the start of the buffer.
    if (SNAPPY_PREDICT_FALSE(static_cast<size_t>(op - base_) < offset))
      return false;

    if (SNAPPY_PREDICT_FALSE((kSlopBytes < 64 && len > kSlopBytes) ||
                            op >= op_limit_min_slop_ || offset < len)) {
      if (op_end > op_limit_ || offset == 0) return false;
      *op_p = IncrementalCopy(op - offset, op, op_end, op_limit_);
      return true;
    }
    std::memmove(op, op - offset, kSlopBytes);
    *op_p = op_end;
    return true;
  }